

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_queue_head_single.h
# Opt level: O1

bool __thiscall
density::detail::
LFQueue_Head<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>
::Consume::is_queue_empty
          (Consume *this,
          LFQueue_Head<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>
          *i_queue)

{
  __pointer_type pLVar1;
  ControlBlock *pCVar2;
  ulong uVar3;
  bool bVar4;
  
  if (0xf < this->m_next_ptr) {
    density_tests::detail::assert_failed<>
              ("empty()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/lf_queue_head_single.h"
               ,0x99);
  }
  if ((i_queue->m_head == (ControlBlock *)0x0) &&
     (pLVar1 = (i_queue->
               super_LFQueue_Tail<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
               ).m_initial_page._M_b._M_p, i_queue->m_head = pLVar1, pLVar1 == (__pointer_type)0x0))
  {
    uVar3 = 0;
  }
  else {
    this->m_queue = i_queue;
    pCVar2 = i_queue->m_head;
    this->m_control = pCVar2;
    uVar3 = pCVar2->m_next;
  }
  this->m_next_ptr = uVar3;
  bVar4 = uVar3 < 0x10;
  if ((uVar3 & 0xb) != 0 && !bVar4) {
    do {
      this->m_control = (ControlBlock *)(uVar3 & 0xfffffffffffffff0);
      uVar3 = ((ControlBlock *)(uVar3 & 0xfffffffffffffff0))->m_next;
      this->m_next_ptr = uVar3;
      bVar4 = uVar3 < 0x10;
      if (bVar4) {
        return bVar4;
      }
    } while ((uVar3 & 0xb) != 0);
  }
  return bVar4;
}

Assistant:

bool is_queue_empty(LFQueue_Head * i_queue) noexcept
                {
                    DENSITY_ASSERT_INTERNAL(empty());

                    begin_iteration(i_queue);
                    while (!empty())
                    {
                        if (
                          (m_next_ptr & (LfQueue_Busy | LfQueue_Dead | LfQueue_InvalidNextPage)) ==
                          0)
                        {
                            return false;
                        }
                        move_next();
                    }
                    return true;
                }